

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

wchar_t archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  uint uVar1;
  wchar_t ocode;
  wchar_t wVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  uchar *bp;
  wchar_t ret;
  wchar_t disp;
  wchar_t c;
  wchar_t ratio;
  wchar_t i;
  private_data_conflict3 *state;
  byte *local_48;
  int local_38;
  int local_30;
  archive_write_filter *f_00;
  long local_20;
  wchar_t local_4;
  
  f_00 = *(archive_write_filter **)(in_RDI + 0x40);
  if (in_RDX == 0) {
    local_4 = L'\0';
  }
  else {
    local_48 = in_RSI;
    local_20 = in_RDX;
    if (f_00->bytes_written == 0) {
      *(uint *)((long)&f_00[0x10d9].bytes_written + 4) = (uint)*in_RSI;
      f_00->bytes_written = f_00->bytes_written + 1;
      local_48 = in_RSI + 1;
      local_20 = in_RDX + -1;
    }
LAB_0016ecf6:
    do {
      while( true ) {
        lVar4 = local_20 + -1;
        if (local_20 == 0) {
          return L'\0';
        }
        pbVar5 = local_48 + 1;
        uVar1 = (uint)*local_48;
        f_00->bytes_written = f_00->bytes_written + 1;
        *(uint *)&f_00[0x10d9].archive =
             uVar1 * 0x10000 + *(int *)((long)&f_00[0x10d9].bytes_written + 4);
        ocode = uVar1 << 8 ^ *(uint *)((long)&f_00[0x10d9].bytes_written + 4);
        local_48 = pbVar5;
        local_20 = lVar4;
        if (*(int *)((long)&f_00->open + (long)ocode * 4 + 4) != *(int *)&f_00[0x10d9].archive)
        break;
        *(uint *)((long)&f_00[0x10d9].bytes_written + 4) =
             (uint)*(ushort *)((long)&f_00[0xb3b].write + (long)ocode * 2);
      }
      if (-1 < *(int *)((long)&f_00->open + (long)ocode * 4 + 4)) {
        if (ocode == L'\0') {
          local_38 = 1;
        }
        else {
          local_38 = 0x10d89 - ocode;
        }
        do {
          ocode = ocode - local_38;
          if (ocode < L'\0') {
            ocode = ocode + L'𐶉';
          }
          if (*(int *)((long)&f_00->open + (long)ocode * 4 + 4) == *(int *)&f_00[0x10d9].archive) {
            *(uint *)((long)&f_00[0x10d9].bytes_written + 4) =
                 (uint)*(ushort *)((long)&f_00[0xb3b].write + (long)ocode * 2);
            goto LAB_0016ecf6;
          }
        } while (-1 < *(int *)((long)&f_00->open + (long)ocode * 4 + 4));
      }
      wVar2 = output_code(f_00,ocode);
      if (wVar2 != L'\0') {
        return wVar2;
      }
      *(uint *)((long)&f_00[0x10d9].bytes_written + 4) = uVar1;
      if (*(int *)&f_00[0x10d8].field_0x5c < *(int *)&f_00->open) {
        iVar3 = *(int *)&f_00[0x10d8].field_0x5c;
        *(int *)&f_00[0x10d8].field_0x5c = iVar3 + 1;
        *(short *)((long)&f_00[0xb3b].write + (long)ocode * 2) = (short)iVar3;
        *(undefined4 *)((long)&f_00->open + (long)ocode * 4 + 4) =
             *(undefined4 *)&f_00[0x10d9].archive;
        goto LAB_0016ecf6;
      }
      if (f_00->bytes_written < (long)f_00->next_filter) goto LAB_0016ecf6;
      f_00->next_filter = (archive_write_filter *)(f_00->bytes_written + 10000);
      if ((f_00->bytes_written < 0x800000) && (f_00->archive != (archive *)0x0)) {
        local_30 = (int)((f_00->bytes_written << 8) / (long)f_00->archive);
      }
      else {
        iVar3 = (int)((long)f_00->archive / 0x100);
        if (iVar3 == 0) {
          local_30 = 0x7fffffff;
        }
        else {
          local_30 = (int)(f_00->bytes_written / (long)iVar3);
        }
      }
      if ((int)f_00[0x10d9].bytes_written < local_30) {
        *(int *)&f_00[0x10d9].bytes_written = local_30;
        goto LAB_0016ecf6;
      }
      *(undefined4 *)&f_00[0x10d9].bytes_written = 0;
      memset((void *)((long)&f_00->open + 4),0xff,0x43624);
      *(undefined4 *)&f_00[0x10d8].field_0x5c = 0x101;
      local_4 = output_code(f_00,ocode);
    } while (local_4 == L'\0');
  }
  return local_4;
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) + state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}